

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O2

CURLUcode curl_url_set(CURLU *u,CURLUPart what,char *part,uint flags)

{
  uchar uVar1;
  byte bVar2;
  byte bVar3;
  _Bool _Var4;
  _Bool _Var5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  CURLUcode CVar9;
  CURLU *pCVar10;
  Curl_handler *pCVar11;
  size_t sVar12;
  uchar *hostname;
  uchar *puVar13;
  size_t sVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  long lVar19;
  uchar uVar20;
  char cVar21;
  char cVar22;
  bool bVar23;
  long lVar24;
  char *__s;
  byte bVar25;
  uchar *puVar26;
  byte *url;
  byte *pbVar27;
  uint uVar28;
  uint uVar29;
  long lStack_90;
  byte *local_80;
  long local_60;
  char *oldurl;
  CURLUPart local_3c;
  CURLU *local_38;
  
  if (u == (CURLU *)0x0) {
    return CURLUE_BAD_HANDLE;
  }
  if (part == (char *)0x0) {
    switch(what) {
    case CURLUPART_URL:
      goto switchD_00144fa7_caseD_0;
    case CURLUPART_SCHEME:
      break;
    case CURLUPART_USER:
      u = (CURLU *)&u->user;
      break;
    case CURLUPART_PASSWORD:
      u = (CURLU *)&u->password;
      break;
    case CURLUPART_OPTIONS:
      u = (CURLU *)&u->options;
      break;
    case CURLUPART_HOST:
      u = (CURLU *)&u->host;
      break;
    case CURLUPART_PORT:
      u->portnum = 0;
      u = (CURLU *)&u->port;
      break;
    case CURLUPART_PATH:
      u = (CURLU *)&u->path;
      break;
    case CURLUPART_QUERY:
      u = (CURLU *)&u->query;
      break;
    case CURLUPART_FRAGMENT:
      u = (CURLU *)&u->fragment;
      break;
    case CURLUPART_ZONEID:
      u = (CURLU *)&u->zoneid;
      break;
    default:
      return CURLUE_UNKNOWN_PART;
    }
    if (u->scheme == (char *)0x0) {
      return CURLUE_OK;
    }
    (*Curl_cfree)(u->scheme);
    u->scheme = (char *)0x0;
    return CURLUE_OK;
  }
  if (CURLUPART_ZONEID < what) {
    return CURLUE_UNKNOWN_PART;
  }
  bVar25 = (byte)(flags >> 7) & 1;
  switch(what) {
  case CURLUPART_URL:
    _Var4 = Curl_is_absolute_url(part,(char *)0x0,0x29);
    if (_Var4) {
      pCVar10 = (CURLU *)(*Curl_ccalloc)(0x68,1);
      if (pCVar10 == (CURLU *)0x0) {
        return CURLUE_OUT_OF_MEMORY;
      }
      CVar9 = parseurl(part,pCVar10,flags);
      goto joined_r0x00145466;
    }
    CVar9 = curl_url_get(u,CURLUPART_URL,&oldurl,flags);
    if (CVar9 != CURLUE_OK) {
      pCVar10 = (CURLU *)(*Curl_ccalloc)(0x68,1);
      if (pCVar10 == (CURLU *)0x0) {
        return CURLUE_OUT_OF_MEMORY;
      }
      CVar9 = parseurl(part,pCVar10,flags);
      goto joined_r0x00145466;
    }
    pcVar15 = (*Curl_cstrdup)(oldurl);
    if (pcVar15 == (char *)0x0) {
      pcVar16 = (char *)0x0;
    }
    else {
      pcVar16 = strstr(pcVar15,"//");
      __s = pcVar16 + 2;
      if (pcVar16 == (char *)0x0) {
        __s = pcVar15;
      }
      cVar21 = *part;
      local_80 = (byte *)part;
      if (cVar21 == '/') {
        if (part[1] != '/') {
          pcVar16 = strchr(__s,0x2f);
          pcVar17 = strchr(__s,0x3f);
          if (pcVar16 == (char *)0x0) {
            if (pcVar17 != (char *)0x0) {
              *pcVar17 = '\0';
            }
          }
          else {
            pcVar18 = pcVar16;
            if (pcVar17 < pcVar16) {
              pcVar18 = pcVar17;
            }
            if (pcVar17 == (char *)0x0) {
              pcVar18 = pcVar16;
            }
            *pcVar18 = '\0';
          }
          goto LAB_0014567b;
        }
        *__s = '\0';
        local_80 = (byte *)find_host_sep(part + 2);
        _Var4 = false;
        url = (byte *)(part + 2);
      }
      else {
        pcVar16 = strchr(__s,0x3f);
        if (pcVar16 != (char *)0x0) {
          *pcVar16 = '\0';
          cVar21 = *part;
        }
        cVar22 = '?';
        if ((cVar21 != '?') &&
           (pcVar16 = strrchr(__s,0x2f), cVar22 = cVar21, pcVar16 != (char *)0x0)) {
          *pcVar16 = '\0';
          cVar22 = *part;
        }
        pcVar16 = strchr(__s,0x2f);
        __s = pcVar16 + 1;
        if (pcVar16 == (char *)0x0) {
          __s = (char *)0x0;
        }
        if (cVar22 == '.') {
          local_80 = (byte *)(part + (ulong)(part[1] == '/') * 2);
        }
        iVar6 = 0;
        for (; ((*local_80 == 0x2e && (local_80[1] == 0x2e)) && (local_80[2] == 0x2f));
            local_80 = local_80 + 3) {
          iVar6 = iVar6 + -1;
        }
        if (pcVar16 == (char *)0x0) {
          __s = (char *)0x0;
        }
        else {
          for (; iVar6 != 0; iVar6 = iVar6 + 1) {
            pcVar17 = strrchr(__s,0x2f);
            if (pcVar17 == (char *)0x0) {
              *__s = '\0';
              __s = pcVar16 + 1;
              break;
            }
            *pcVar17 = '\0';
          }
        }
LAB_0014567b:
        _Var4 = true;
        url = local_80;
      }
      bVar23 = true;
      lVar24 = 0;
      for (pbVar27 = url; *pbVar27 != 0; pbVar27 = pbVar27 + 1) {
        if (pbVar27 < local_80) {
          lVar24 = lVar24 + 1;
        }
        else {
          uVar7 = (uint)*pbVar27;
          if (uVar7 == 0x20) {
            if (bVar23) {
              lVar24 = lVar24 + 3;
              bVar23 = true;
            }
            else {
              lVar24 = lVar24 + 1;
              bVar23 = false;
            }
          }
          else {
            if (uVar7 == 0x3f) {
              bVar23 = false;
            }
            _Var5 = urlchar_needs_escaping(uVar7);
            lVar19 = lVar24 + 2;
            if (!_Var5) {
              lVar19 = lVar24;
            }
            lVar24 = lVar19 + 1;
          }
        }
      }
      sVar12 = strlen(pcVar15);
      pcVar16 = (char *)(*Curl_cmalloc)(lVar24 + sVar12 + 2);
      if (pcVar16 != (char *)0x0) {
        memcpy(pcVar16,pcVar15,sVar12);
        bVar25 = *url;
        if (bVar25 != 0x2f) {
          if (__s == (char *)0x0) {
            if (bVar25 != 0x3f) goto LAB_00145731;
          }
          else if ((bVar25 != 0x3f) && (*__s != '\0')) {
LAB_00145731:
            pcVar16[sVar12] = '/';
            sVar12 = sVar12 + 1;
          }
        }
        strcpy_url(pcVar16 + sVar12,(char *)url,_Var4);
      }
      (*Curl_cfree)(pcVar15);
    }
    (*Curl_cfree)(oldurl);
    if (pcVar16 == (char *)0x0) {
      return CURLUE_OUT_OF_MEMORY;
    }
    pCVar10 = (CURLU *)(*Curl_ccalloc)(0x68,1);
    if (pCVar10 == (CURLU *)0x0) {
      (*Curl_cfree)(pcVar16);
      return CURLUE_OUT_OF_MEMORY;
    }
    CVar9 = parseurl(pcVar16,pCVar10,flags);
    (*Curl_cfree)(pcVar16);
joined_r0x00145466:
    if (CVar9 == CURLUE_OK) {
      mv_urlhandle(pCVar10,u);
      return CURLUE_OK;
    }
    curl_url_cleanup(pCVar10);
    return CVar9;
  case CURLUPART_SCHEME:
    sVar12 = strlen(part);
    if (0x28 < sVar12) {
      return CURLUE_MALFORMED_INPUT;
    }
    if (((flags & 8) == 0) && (pCVar11 = Curl_builtin_scheme(part), pCVar11 == (Curl_handler *)0x0))
    {
      return CURLUE_UNSUPPORTED_SCHEME;
    }
    uVar7 = 0;
    bVar2 = 0;
    bVar3 = 0;
    bVar25 = 0;
    local_60 = 0;
    pCVar10 = u;
    goto LAB_001450a3;
  case CURLUPART_USER:
    pCVar10 = (CURLU *)&u->user;
    break;
  case CURLUPART_PASSWORD:
    pCVar10 = (CURLU *)&u->password;
    break;
  case CURLUPART_OPTIONS:
    pCVar10 = (CURLU *)&u->options;
    break;
  case CURLUPART_HOST:
    pCVar10 = (CURLU *)&u->host;
    (*Curl_cfree)(u->zoneid);
    u->zoneid = (char *)0x0;
    break;
  case CURLUPART_PORT:
    local_60 = strtol(part,&oldurl,10);
    if (local_60 - 0x10000U < 0xffffffffffff0001) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    if (*oldurl != '\0') {
      return CURLUE_MALFORMED_INPUT;
    }
    uVar7 = 0;
    bVar2 = 0;
    bVar3 = 0;
    bVar25 = 0;
    pCVar10 = (CURLU *)&u->port;
    goto LAB_001450a3;
  case CURLUPART_PATH:
    pCVar10 = (CURLU *)&u->path;
    bVar2 = 1;
    goto LAB_00145091;
  case CURLUPART_QUERY:
    uVar7 = flags >> 8;
    pCVar10 = (CURLU *)&u->query;
    bVar2 = 0;
    bVar3 = bVar25;
    goto LAB_0014509a;
  case CURLUPART_FRAGMENT:
    pCVar10 = (CURLU *)&u->fragment;
    break;
  case CURLUPART_ZONEID:
    pCVar10 = (CURLU *)&u->zoneid;
  }
  bVar2 = 0;
LAB_00145091:
  uVar7 = 0;
  bVar3 = 0;
LAB_0014509a:
  local_60 = 0;
LAB_001450a3:
  sVar12 = strlen(part);
  if (8000000 < sVar12) {
    return CURLUE_MALFORMED_INPUT;
  }
  local_3c = what;
  local_38 = pCVar10;
  if (bVar25 == 0) {
    hostname = (uchar *)(*Curl_cstrdup)(part);
    if (hostname == (uchar *)0x0) {
      return CURLUE_OUT_OF_MEMORY;
    }
    lVar24 = 1;
    puVar26 = hostname;
    do {
      lVar19 = lVar24;
      if (*puVar26 == '%') {
        iVar6 = Curl_isxdigit((uint)puVar26[1]);
        if (((iVar6 != 0) && (iVar6 = Curl_isxdigit((uint)puVar26[2]), iVar6 != 0)) &&
           ((iVar6 = Curl_isupper((uint)puVar26[1]), iVar6 != 0 ||
            (iVar6 = Curl_isupper((uint)puVar26[2]), iVar6 != 0)))) {
          iVar6 = tolower((uint)puVar26[1]);
          puVar26[1] = (uchar)iVar6;
          iVar6 = tolower((uint)puVar26[2]);
          puVar26[2] = (uchar)iVar6;
          lVar19 = 3;
        }
      }
      else if (*puVar26 == '\0') goto LAB_001452bf;
      puVar26 = puVar26 + lVar19;
    } while( true );
  }
  hostname = (uchar *)(*Curl_cmalloc)(sVar12 * 3 + 1);
  if (hostname == (uchar *)0x0) {
    return CURLUE_OUT_OF_MEMORY;
  }
  puVar26 = hostname;
  uVar28 = uVar7;
  puVar13 = (uchar *)part;
  if (bVar3 != 0) {
    lVar24 = 0;
    while( true ) {
      uVar1 = part[lVar24];
      uVar20 = '+';
      if ((uVar1 != ' ') && (uVar20 = uVar1, uVar1 == '\0')) break;
      hostname[lVar24] = uVar20;
      lVar24 = lVar24 + 1;
    }
    hostname[lVar24] = '\0';
    part = (*Curl_cstrdup)((char *)hostname);
    puVar13 = (uchar *)part;
    if ((uchar *)part == (uchar *)0x0) goto LAB_00145491;
  }
  for (; *part != '\0'; part = (char *)((uchar *)part + 1)) {
    _Var4 = Curl_isunreserved(*part);
    uVar1 = *part;
    if ((bool)(uVar1 == '/' & bVar2) || _Var4) {
LAB_00145245:
      uVar8 = uVar28 & 0xff;
      uVar29 = uVar8;
      if ((uVar28 & 1) != 0) {
        uVar29 = 0;
      }
      uVar28 = uVar29;
      if (uVar1 != '=') {
        uVar28 = uVar8;
      }
      *puVar26 = uVar1;
      lStack_90 = 1;
    }
    else {
      if (uVar1 != '=') {
        if (uVar1 != '+' || bVar3 != 1) goto LAB_00145281;
        goto LAB_00145245;
      }
      if ((uVar28 & 1) != 0) goto LAB_00145245;
LAB_00145281:
      curl_msnprintf((char *)puVar26,4,"%%%02x");
      lStack_90 = 3;
    }
    puVar26 = puVar26 + lStack_90;
  }
  *puVar26 = '\0';
  if (bVar3 != 0) {
    (*Curl_cfree)(puVar13);
  }
LAB_001452bf:
  if ((((uVar7 & 1) == 0) || (pcVar15 = u->query, pcVar15 == (char *)0x0)) ||
     (sVar12 = strlen(pcVar15), sVar12 == 0)) {
    if (((local_3c == CURLUPART_HOST) && (((flags >> 10 & 1) == 0 || (*hostname != '\0')))) &&
       (CVar9 = hostname_check(u,(char *)hostname), CVar9 != CURLUE_OK)) {
      (*Curl_cfree)(hostname);
      return CURLUE_MALFORMED_INPUT;
    }
    pCVar10 = local_38;
    (*Curl_cfree)(local_38->scheme);
    pCVar10->scheme = (char *)hostname;
    if (local_60 != 0) {
      u->portnum = local_60;
      return CURLUE_OK;
    }
    return CURLUE_OK;
  }
  cVar21 = pcVar15[sVar12 - 1];
  sVar14 = strlen((char *)hostname);
  lVar24 = (cVar21 != '&') + sVar12;
  pcVar15 = (char *)(*Curl_cmalloc)(sVar14 + lVar24 + 1);
  if (pcVar15 != (char *)0x0) {
    strcpy(pcVar15,u->query);
    if (cVar21 != '&') {
      pcVar15[sVar12] = '&';
    }
    strcpy(pcVar15 + lVar24,(char *)hostname);
    (*Curl_cfree)(hostname);
    pCVar10 = local_38;
    (*Curl_cfree)(local_38->scheme);
    pCVar10->scheme = pcVar15;
switchD_00144fa7_caseD_0:
    return CURLUE_OK;
  }
LAB_00145491:
  (*Curl_cfree)(hostname);
  return CURLUE_OUT_OF_MEMORY;
}

Assistant:

CURLUcode curl_url_set(CURLU *u, CURLUPart what,
                       const char *part, unsigned int flags)
{
  char **storep = NULL;
  long port = 0;
  bool urlencode = (flags & CURLU_URLENCODE)? 1 : 0;
  bool plusencode = FALSE;
  bool urlskipslash = FALSE;
  bool appendquery = FALSE;
  bool equalsencode = FALSE;

  if(!u)
    return CURLUE_BAD_HANDLE;
  if(!part) {
    /* setting a part to NULL clears it */
    switch(what) {
    case CURLUPART_URL:
      break;
    case CURLUPART_SCHEME:
      storep = &u->scheme;
      break;
    case CURLUPART_USER:
      storep = &u->user;
      break;
    case CURLUPART_PASSWORD:
      storep = &u->password;
      break;
    case CURLUPART_OPTIONS:
      storep = &u->options;
      break;
    case CURLUPART_HOST:
      storep = &u->host;
      break;
    case CURLUPART_ZONEID:
      storep = &u->zoneid;
      break;
    case CURLUPART_PORT:
      u->portnum = 0;
      storep = &u->port;
      break;
    case CURLUPART_PATH:
      storep = &u->path;
      break;
    case CURLUPART_QUERY:
      storep = &u->query;
      break;
    case CURLUPART_FRAGMENT:
      storep = &u->fragment;
      break;
    default:
      return CURLUE_UNKNOWN_PART;
    }
    if(storep && *storep) {
      Curl_safefree(*storep);
    }
    return CURLUE_OK;
  }

  switch(what) {
  case CURLUPART_SCHEME:
    if(strlen(part) > MAX_SCHEME_LEN)
      /* too long */
      return CURLUE_MALFORMED_INPUT;
    if(!(flags & CURLU_NON_SUPPORT_SCHEME) &&
       /* verify that it is a fine scheme */
       !Curl_builtin_scheme(part))
      return CURLUE_UNSUPPORTED_SCHEME;
    storep = &u->scheme;
    urlencode = FALSE; /* never */
    break;
  case CURLUPART_USER:
    storep = &u->user;
    break;
  case CURLUPART_PASSWORD:
    storep = &u->password;
    break;
  case CURLUPART_OPTIONS:
    storep = &u->options;
    break;
  case CURLUPART_HOST:
    storep = &u->host;
    Curl_safefree(u->zoneid);
    break;
  case CURLUPART_ZONEID:
    storep = &u->zoneid;
    break;
  case CURLUPART_PORT:
  {
    char *endp;
    urlencode = FALSE; /* never */
    port = strtol(part, &endp, 10);  /* Port number must be decimal */
    if((port <= 0) || (port > 0xffff))
      return CURLUE_BAD_PORT_NUMBER;
    if(*endp)
      /* weirdly provided number, not good! */
      return CURLUE_MALFORMED_INPUT;
    storep = &u->port;
  }
  break;
  case CURLUPART_PATH:
    urlskipslash = TRUE;
    storep = &u->path;
    break;
  case CURLUPART_QUERY:
    plusencode = urlencode;
    appendquery = (flags & CURLU_APPENDQUERY)?1:0;
    equalsencode = appendquery;
    storep = &u->query;
    break;
  case CURLUPART_FRAGMENT:
    storep = &u->fragment;
    break;
  case CURLUPART_URL: {
    /*
     * Allow a new URL to replace the existing (if any) contents.
     *
     * If the existing contents is enough for a URL, allow a relative URL to
     * replace it.
     */
    CURLUcode result;
    char *oldurl;
    char *redired_url;
    CURLU *handle2;

    if(Curl_is_absolute_url(part, NULL, MAX_SCHEME_LEN + 1)) {
      handle2 = curl_url();
      if(!handle2)
        return CURLUE_OUT_OF_MEMORY;
      result = parseurl(part, handle2, flags);
      if(!result)
        mv_urlhandle(handle2, u);
      else
        curl_url_cleanup(handle2);
      return result;
    }
    /* extract the full "old" URL to do the redirect on */
    result = curl_url_get(u, CURLUPART_URL, &oldurl, flags);
    if(result) {
      /* couldn't get the old URL, just use the new! */
      handle2 = curl_url();
      if(!handle2)
        return CURLUE_OUT_OF_MEMORY;
      result = parseurl(part, handle2, flags);
      if(!result)
        mv_urlhandle(handle2, u);
      else
        curl_url_cleanup(handle2);
      return result;
    }

    /* apply the relative part to create a new URL */
    redired_url = concat_url(oldurl, part);
    free(oldurl);
    if(!redired_url)
      return CURLUE_OUT_OF_MEMORY;

    /* now parse the new URL */
    handle2 = curl_url();
    if(!handle2) {
      free(redired_url);
      return CURLUE_OUT_OF_MEMORY;
    }
    result = parseurl(redired_url, handle2, flags);
    free(redired_url);
    if(!result)
      mv_urlhandle(handle2, u);
    else
      curl_url_cleanup(handle2);
    return result;
  }
  default:
    return CURLUE_UNKNOWN_PART;
  }
  DEBUGASSERT(storep);
  {
    const char *newp = part;
    size_t nalloc = strlen(part);

    if(nalloc > CURL_MAX_INPUT_LENGTH)
      /* excessive input length */
      return CURLUE_MALFORMED_INPUT;

    if(urlencode) {
      const unsigned char *i;
      char *o;
      bool free_part = FALSE;
      char *enc = malloc(nalloc * 3 + 1); /* for worst case! */
      if(!enc)
        return CURLUE_OUT_OF_MEMORY;
      if(plusencode) {
        /* space to plus */
        i = (const unsigned char *)part;
        for(o = enc; *i; ++o, ++i)
          *o = (*i == ' ') ? '+' : *i;
        *o = 0; /* null-terminate */
        part = strdup(enc);
        if(!part) {
          free(enc);
          return CURLUE_OUT_OF_MEMORY;
        }
        free_part = TRUE;
      }
      for(i = (const unsigned char *)part, o = enc; *i; i++) {
        if(Curl_isunreserved(*i) ||
           ((*i == '/') && urlskipslash) ||
           ((*i == '=') && equalsencode) ||
           ((*i == '+') && plusencode)) {
          if((*i == '=') && equalsencode)
            /* only skip the first equals sign */
            equalsencode = FALSE;
          *o = *i;
          o++;
        }
        else {
          msnprintf(o, 4, "%%%02x", *i);
          o += 3;
        }
      }
      *o = 0; /* null-terminate */
      newp = enc;
      if(free_part)
        free((char *)part);
    }
    else {
      char *p;
      newp = strdup(part);
      if(!newp)
        return CURLUE_OUT_OF_MEMORY;
      p = (char *)newp;
      while(*p) {
        /* make sure percent encoded are lower case */
        if((*p == '%') && ISXDIGIT(p[1]) && ISXDIGIT(p[2]) &&
           (ISUPPER(p[1]) || ISUPPER(p[2]))) {
          p[1] = (char)TOLOWER(p[1]);
          p[2] = (char)TOLOWER(p[2]);
          p += 3;
        }
        else
          p++;
      }
    }

    if(appendquery) {
      /* Append the string onto the old query. Add a '&' separator if none is
         present at the end of the exsting query already */
      size_t querylen = u->query ? strlen(u->query) : 0;
      bool addamperand = querylen && (u->query[querylen -1] != '&');
      if(querylen) {
        size_t newplen = strlen(newp);
        char *p = malloc(querylen + addamperand + newplen + 1);
        if(!p) {
          free((char *)newp);
          return CURLUE_OUT_OF_MEMORY;
        }
        strcpy(p, u->query); /* original query */
        if(addamperand)
          p[querylen] = '&'; /* ampersand */
        strcpy(&p[querylen + addamperand], newp); /* new suffix */
        free((char *)newp);
        free(*storep);
        *storep = p;
        return CURLUE_OK;
      }
    }

    if(what == CURLUPART_HOST) {
      if(0 == strlen(newp) && (flags & CURLU_NO_AUTHORITY)) {
        /* Skip hostname check, it's allowed to be empty. */
      }
      else {
        if(hostname_check(u, (char *)newp)) {
          free((char *)newp);
          return CURLUE_MALFORMED_INPUT;
        }
      }
    }

    free(*storep);
    *storep = (char *)newp;
  }
  /* set after the string, to make it not assigned if the allocation above
     fails */
  if(port)
    u->portnum = port;
  return CURLUE_OK;
}